

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O0

void __thiscall
BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Coalesce
          (BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *C,
          IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *D,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k2)

{
  value_type vVar1;
  int iVar2;
  reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  bool bVar8;
  string local_378 [32];
  Addr local_358;
  Addr local_350;
  Addr temp_p;
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2e8;
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_288;
  Addr local_228;
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_220;
  int local_1c0;
  int local_1bc;
  int pos;
  int m;
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> P;
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> E;
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k2_local;
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *D_local;
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *C_local;
  BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  local_28 = k2;
  k2_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)D;
  D_local = C;
  C_local = (IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)this;
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  IndexNode(&local_88,C);
  LockNode(this,&local_88);
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~IndexNode(&local_88);
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  IndexNode((IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&E.self,
            (IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)k2_local);
  LockNode(this,(IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&E.self);
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~IndexNode((IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&E.self);
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  IndexNode((IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&P.self,this->N);
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  IndexNode((IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&pos,this->N);
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  IndexNode(&local_220,D_local);
  iVar2 = IsLeaf(this,&local_220);
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~IndexNode(&local_220);
  if (iVar2 == 0) {
    local_1c0 = 0;
    while( true ) {
      bVar8 = false;
      if (local_1c0 < this->N + -1) {
        pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                           ((vector<char,_std::allocator<char>_> *)(k2_local + 0x20),(long)local_1c0
                           );
        bVar8 = *pvVar3 == '1';
      }
      if (!bVar8) break;
      local_1c0 = local_1c0 + 1;
    }
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(k2_local + 8),(long)local_1c0);
    std::__cxx11::string::operator=((string *)pvVar4,(string *)k2);
    pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)(k2_local + 0x20),(long)local_1c0);
    *pvVar3 = '1';
    local_1c0 = local_1c0 + 1;
    local_1bc = 0;
    while (pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                              (&D_local->v,(long)local_1bc), *pvVar3 == '1') {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&D_local->k,(long)local_1bc);
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)(k2_local + 8),(long)(local_1c0 + local_1bc));
      std::__cxx11::string::operator=((string *)pvVar5,(string *)pvVar4);
      pvVar6 = std::vector<Addr,_std::allocator<Addr>_>::operator[](&D_local->p,(long)local_1bc);
      pvVar7 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                         ((vector<Addr,_std::allocator<Addr>_> *)(k2_local + 0x38),
                          (long)(local_1c0 + local_1bc));
      *pvVar7 = *pvVar6;
      pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](&D_local->v,(long)local_1bc);
      vVar1 = *pvVar3;
      pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)(k2_local + 0x20),
                          (long)(local_1c0 + local_1bc));
      *pvVar3 = vVar1;
      local_1bc = local_1bc + 1;
    }
    pvVar6 = std::vector<Addr,_std::allocator<Addr>_>::operator[](&D_local->p,(long)local_1bc);
    pvVar7 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                       ((vector<Addr,_std::allocator<Addr>_> *)(k2_local + 0x38),
                        (long)(local_1c0 + local_1bc));
    *pvVar7 = *pvVar6;
    local_1bc = 0;
    while( true ) {
      bVar8 = false;
      if (local_1bc < this->N) {
        pvVar6 = std::vector<Addr,_std::allocator<Addr>_>::operator[](&D_local->p,(long)local_1bc);
        bVar8 = pvVar6->FileOff != -1;
      }
      if (!bVar8) break;
      pvVar6 = std::vector<Addr,_std::allocator<Addr>_>::operator[](&D_local->p,(long)local_1bc);
      local_228.BlockNum = pvVar6->BlockNum;
      local_228.FileOff = pvVar6->FileOff;
      FindNode(this,local_228,
               (IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&P.self);
      E.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = *(pointer *)(k2_local + 0x58);
      IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      IndexNode(&local_288,
                (IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&P.self);
      UpdateBlock(this,&local_288);
      IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~IndexNode(&local_288);
      local_1bc = local_1bc + 1;
    }
  }
  else {
    local_1c0 = 0;
    while( true ) {
      bVar8 = false;
      if (local_1c0 < this->N + -1) {
        pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                           ((vector<char,_std::allocator<char>_> *)(k2_local + 0x20),(long)local_1c0
                           );
        bVar8 = *pvVar3 == '1';
      }
      if (!bVar8) break;
      local_1c0 = local_1c0 + 1;
    }
    local_1bc = 0;
    while (pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                              (&D_local->v,(long)local_1bc), *pvVar3 == '1') {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&D_local->k,(long)local_1bc);
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)(k2_local + 8),(long)(local_1c0 + local_1bc));
      std::__cxx11::string::operator=((string *)pvVar5,(string *)pvVar4);
      pvVar6 = std::vector<Addr,_std::allocator<Addr>_>::operator[](&D_local->p,(long)local_1bc);
      pvVar7 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                         ((vector<Addr,_std::allocator<Addr>_> *)(k2_local + 0x38),
                          (long)(local_1c0 + local_1bc));
      *pvVar7 = *pvVar6;
      pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](&D_local->v,(long)local_1bc);
      vVar1 = *pvVar3;
      pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)(k2_local + 0x20),
                          (long)(local_1c0 + local_1bc));
      *pvVar3 = vVar1;
      local_1bc = local_1bc + 1;
    }
    pvVar6 = std::vector<Addr,_std::allocator<Addr>_>::operator[](&D_local->p,(long)(this->N + -1));
    pvVar7 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                       ((vector<Addr,_std::allocator<Addr>_> *)(k2_local + 0x38),
                        (long)(this->N + -1));
    *pvVar7 = *pvVar6;
  }
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  IndexNode(&local_2e8,D_local);
  UpdateBlock(this,&local_2e8);
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~IndexNode(&local_2e8);
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  IndexNode((IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&temp_p,
            (IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)k2_local);
  UpdateBlock(this,(IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&temp_p);
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~IndexNode((IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&temp_p);
  local_350 = D_local->self;
  local_358 = D_local->parent;
  FindNode(this,local_358,
           (IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)&pos);
  std::__cxx11::string::string(local_378,(string *)k2);
  Delete_Aux(this,(IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&pos,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378,
             D_local->self);
  std::__cxx11::string::~string(local_378);
  FindNode(this,local_350,
           (IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)&P.self);
  DeleteNode(this,(IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&P.self);
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~IndexNode((IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&pos);
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~IndexNode((IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&P.self);
  return;
}

Assistant:

void BpTree<K>::Coalesce(IndexNode<K>& C, IndexNode<K>& D, K k2) {
	this->LockNode(C);
	this->LockNode(D);
	IndexNode<K> E(N);
	IndexNode<K> P(N);
	int m, pos;
	if (!this->IsLeaf(C)) {
		//��Ҷ�ڵ�֮��ĺϲ�
		for (pos = 0; pos < N - 1 && D.v[pos] == '1'; pos++);	//D.k[pos]�ǿյģ�D.p[pos+1]�ǿյ�
		D.k[pos] = k2;
		D.v[pos] = '1';
		pos++;
		for (m = 0; C.v[m] == '1'; m++) {
			D.k[pos + m] = C.k[m];
			D.p[pos + m] = C.p[m];
			D.v[pos + m] = C.v[m];
		}
		D.p[pos + m] = C.p[m];
		for (m = 0; m < N && C.p[m].FileOff != -1; m++) {
			this->FindNode(C.p[m], E);
			E.parent = D.self;
			this->UpdateBlock(E);
		}
	}
	else {
		//Ҷ�ڵ�֮��ĺϲ�
		for (pos = 0; pos < N - 1 && D.v[pos] == '1'; pos++);	//D.k[pos]�ǿյģ�D.p[pos]�ǿյ�
		for (m = 0; C.v[m] == '1'; m++) {
			D.k[pos + m] = C.k[m];
			D.p[pos + m] = C.p[m];
			D.v[pos + m] = C.v[m];
		}
		D.p[N - 1] = C.p[N - 1];
	}
	this->UpdateBlock(C);
	this->UpdateBlock(D);
	Addr temp_p = C.self;
	this->FindNode(C.parent, P);
	this->Delete_Aux(P, k2, C.self);
	this->FindNode(temp_p, E);
	this->DeleteNode(E);
	return;
}